

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O3

int __thiscall QTreeWidget::topLevelItemCount(QTreeWidget *this)

{
  long lVar1;
  
  lVar1 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  return *(int *)(*(long *)(lVar1 + 0x10) + 0x50);
}

Assistant:

int QTreeWidget::topLevelItemCount() const
{
    Q_D(const QTreeWidget);
    return d->treeModel()->rootItem->childCount();
}